

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsAddFuncBody_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field)

{
  bool bVar1;
  FullType FVar2;
  char *pcVar3;
  allocator<char> local_13a;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string typname_2;
  undefined1 local_d8 [8];
  string typname_1;
  undefined1 local_98 [8];
  string underlying_typname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string typname;
  Type *type;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  typname.field_2._8_8_ = &field->value;
  FVar2 = anon_unknown_26::GetFullType(&(field->value).type);
  switch(FVar2) {
  case ftInteger:
  case ftFloat:
  case ftBool:
    GetTypeBasic_abi_cxx11_((string *)local_48,this,&(field->value).type);
    bVar1 = FieldDef::IsOptional(field);
    pcVar3 = "self.fbb_.push_slot::<";
    if (bVar1) {
      pcVar3 = "self.fbb_.push_slot_always::<";
    }
    std::operator+(&local_68,pcVar3,(string *)local_48);
    std::operator+(__return_storage_ptr__,&local_68,">");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
    break;
  case ftStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_d8,this,*(Definition **)(typname.field_2._8_8_ + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_2.field_2 + 8),"self.fbb_.push_slot_always::<&",
                   (string *)local_d8);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_2.field_2 + 8),">");
    std::__cxx11::string::~string((string *)(typname_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_d8);
    break;
  case ftTable:
    WrapInNameSpace_abi_cxx11_((string *)local_118,this,*(Definition **)(typname.field_2._8_8_ + 8))
    ;
    std::operator+(&local_138,"self.fbb_.push_slot_always::<flatbuffers::WIPOffset<",
                   (string *)local_118);
    std::operator+(__return_storage_ptr__,&local_138,">>");
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)local_118);
    break;
  case ftEnumKey:
  case ftUnionKey:
    GetTypeBasic_abi_cxx11_((string *)local_98,this,(Type *)typname.field_2._8_8_);
    bVar1 = FieldDef::IsOptional(field);
    pcVar3 = "self.fbb_.push_slot::<";
    if (bVar1) {
      pcVar3 = "self.fbb_.push_slot_always::<";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8),pcVar3,(string *)local_98);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8),">");
    std::__cxx11::string::~string((string *)(typname_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_98);
    break;
  case ftUnionValue:
  case ftString:
  case ftVectorOfInteger:
  case ftVectorOfFloat:
  case ftVectorOfBool:
  case ftVectorOfEnumKey:
  case ftVectorOfStruct:
  case ftVectorOfTable:
  case ftVectorOfString:
  case ftVectorOfUnionValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "self.fbb_.push_slot_always::<flatbuffers::WIPOffset<_>>",&local_139);
    std::allocator<char>::~allocator(&local_139);
    break;
  case ftArrayOfBuiltin:
  case ftArrayOfEnum:
  case ftArrayOfStruct:
    __assert_fail("false && \"arrays are not supported within tables\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x598,
                  "std::string flatbuffers::rust::RustGenerator::TableBuilderArgsAddFuncBody(const FieldDef &)"
                 );
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CODE_GENERATION",&local_13a);
    std::allocator<char>::~allocator(&local_13a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TableBuilderArgsAddFuncBody(const FieldDef &field) {
    const Type &type = field.value.type;

    switch (GetFullType(field.value.type)) {
      case ftInteger:
      case ftBool:
      case ftFloat: {
        const auto typname = GetTypeBasic(field.value.type);
        return (field.IsOptional() ? "self.fbb_.push_slot_always::<"
                                   : "self.fbb_.push_slot::<") +
               typname + ">";
      }
      case ftEnumKey:
      case ftUnionKey: {
        const auto underlying_typname = GetTypeBasic(type);
        return (field.IsOptional() ? "self.fbb_.push_slot_always::<"
                                   : "self.fbb_.push_slot::<") +
               underlying_typname + ">";
      }

      case ftStruct: {
        const std::string typname = WrapInNameSpace(*type.struct_def);
        return "self.fbb_.push_slot_always::<&" + typname + ">";
      }
      case ftTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "self.fbb_.push_slot_always::<flatbuffers::WIPOffset<" +
               typname + ">>";
      }

      case ftUnionValue:
      case ftString:
      case ftVectorOfInteger:
      case ftVectorOfFloat:
      case ftVectorOfBool:
      case ftVectorOfEnumKey:
      case ftVectorOfStruct:
      case ftVectorOfTable:
      case ftVectorOfString:
      case ftVectorOfUnionValue: {
        return "self.fbb_.push_slot_always::<flatbuffers::WIPOffset<_>>";
      }
      case ftArrayOfEnum:
      case ftArrayOfStruct:
      case ftArrayOfBuiltin: {
        FLATBUFFERS_ASSERT(false && "arrays are not supported within tables");
        return "ARRAYS_NOT_SUPPORTED_IN_TABLES";
      }
    }
    return "INVALID_CODE_GENERATION";  // for return analysis
  }